

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

Real __thiscall
amrex::MLMG::solve(MLMG *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_sol,
                  Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_rhs,Real a_tol_rel,
                  Real a_tol_abs,char *checkpoint_file)

{
  long *plVar1;
  initializer_list<std::reference_wrapper<double>_> iVar2;
  bool bVar3;
  int iVar4;
  MultiFab *pMVar5;
  MultiFab **ppMVar6;
  double *pdVar7;
  int *piVar8;
  Any *pAVar9;
  Any *pAVar10;
  long in_RCX;
  int *in_RDI;
  double dVar11;
  int alev;
  IntVect ng_back;
  Real crse_norminf;
  bool fine_converged;
  Real fine_norminf;
  int iter;
  int niters;
  bool converged;
  double iter_start_time;
  Real res_target;
  string norm_name;
  Real max_norm;
  Real rhsnorm0;
  Real resnorm0;
  bool local;
  Real *composite_norminf;
  double solve_start_time;
  bool is_nsolve;
  int lev;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> mf_rhs;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> mf_sol;
  int in_stack_ffffffffffffef38;
  MPI_Comm in_stack_ffffffffffffef3c;
  Print *in_stack_ffffffffffffef40;
  undefined4 in_stack_ffffffffffffef48;
  int in_stack_ffffffffffffef4c;
  MLMG *in_stack_ffffffffffffef50;
  Any *in_stack_ffffffffffffef58;
  MLMG *in_stack_ffffffffffffef60;
  ostream *in_stack_ffffffffffffef68;
  MLMG *in_stack_ffffffffffffef70;
  Any *in_stack_ffffffffffffef78;
  undefined1 local_51;
  MLMG *in_stack_ffffffffffffef80;
  Print *in_stack_ffffffffffffefb0;
  undefined8 in_stack_ffffffffffffefb8;
  MLMG *in_stack_ffffffffffffefc0;
  undefined8 in_stack_ffffffffffffeff8;
  MLMG *in_stack_fffffffffffff000;
  int local_eb4;
  int local_c98;
  IntVect local_c94;
  double local_c88;
  double local_af8;
  int local_aec;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_fffffffffffff530;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_fffffffffffff538;
  MLMG *in_stack_fffffffffffff540;
  char *in_stack_fffffffffffff578;
  Real in_stack_fffffffffffff580;
  Real in_stack_fffffffffffff588;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_fffffffffffff590;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff598;
  MLMG *in_stack_fffffffffffff5a0;
  Real local_630;
  undefined1 local_621;
  double local_620;
  int local_618;
  int local_614;
  double local_488;
  int local_47c;
  int local_478;
  byte local_471;
  double local_470;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  string local_2c8 [32];
  double local_2a8;
  undefined1 local_110 [16];
  undefined1 *local_100;
  undefined8 local_f8;
  Real local_d8;
  Real local_d0;
  undefined1 local_c1;
  double *local_c0;
  double local_b8;
  byte local_a9;
  int local_a8;
  double local_50;
  double local_48 [4];
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  IntVect *local_8;
  
  if (in_RCX != 0) {
    Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
              ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffef40,
               CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    bVar3 = Any::is<amrex::MultiFab>((Any *)0x12552a1);
    if (bVar3) {
      std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x12552d3);
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffef40,
                 CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38),
                 (allocator_type *)0x12552f0);
      std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x12552ff);
      std::allocator<const_amrex::MultiFab_*>::allocator
                ((allocator<const_amrex::MultiFab_*> *)0x1255328);
      Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffef40,
                 CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38),
                 (allocator_type *)0x1255345);
      std::allocator<const_amrex::MultiFab_*>::~allocator
                ((allocator<const_amrex::MultiFab_*> *)0x1255354);
      for (local_a8 = 0; local_a8 < in_RDI[0x14]; local_a8 = local_a8 + 1) {
        Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                  ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffef40,
                   CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        pMVar5 = Any::get<amrex::MultiFab>(in_stack_ffffffffffffef58);
        ppMVar6 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                             in_stack_ffffffffffffef40,
                             CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        *ppMVar6 = pMVar5;
        Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                  ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffef40,
                   CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        pMVar5 = Any::get<amrex::MultiFab>(in_stack_ffffffffffffef78);
        ppMVar6 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_ffffffffffffef40,
                             CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        *ppMVar6 = pMVar5;
      }
      checkPoint(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 in_stack_fffffffffffff588,in_stack_fffffffffffff580,in_stack_fffffffffffff578);
      Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 0x12554cd);
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x12554da);
    }
    else {
      local_18 = "MLMG::solve: checkpoint not supported for non-MultiFab type";
      Abort_host((char *)in_stack_ffffffffffffef50);
    }
  }
  local_51 = (undefined1)((ulong)in_stack_ffffffffffffef78 >> 0x38);
  if (in_RDI[8] == 0) {
    iVar4 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x20))();
    in_RDI[8] = iVar4;
  }
  local_a9 = *(long *)(*(long *)(in_RDI + 0x12) + 0x68) != 0;
  local_b8 = second();
  local_c0 = (double *)(in_RDI + 0x58);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1255589);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x125559d);
  prepareForSolve(in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  computeMLResidual(in_stack_ffffffffffffefc0,(int)((ulong)in_stack_ffffffffffffefb8 >> 0x20));
  local_c1 = 1;
  local_d0 = MLResNormInf(in_stack_ffffffffffffef60,(int)((ulong)in_stack_ffffffffffffef58 >> 0x20),
                          SUB81((ulong)in_stack_ffffffffffffef58 >> 0x18,0));
  local_d8 = MLRhsNormInf(in_stack_ffffffffffffef80,(bool)local_51);
  if ((local_a9 & 1) == 0) {
    std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
              ((reference_wrapper<double> *)in_stack_ffffffffffffef40,
               (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
              ((reference_wrapper<double> *)in_stack_ffffffffffffef40,
               (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    local_f8 = 2;
    local_100 = local_110;
    std::allocator<std::reference_wrapper<double>_>::allocator
              ((allocator<std::reference_wrapper<double>_> *)0x125568a);
    iVar2._M_array._4_4_ = in_stack_ffffffffffffef4c;
    iVar2._M_array._0_4_ = in_stack_ffffffffffffef48;
    iVar2._M_len = (size_type)in_stack_ffffffffffffef50;
    Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::vector
              ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                *)in_stack_ffffffffffffef40,iVar2,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Max<double>
              ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                *)in_stack_ffffffffffffef40,in_stack_ffffffffffffef3c);
    Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
    ~Vector((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
             *)0x12556d4);
    std::allocator<std::reference_wrapper<double>_>::~allocator
              ((allocator<std::reference_wrapper<double>_> *)0x12556e1);
    if (0 < *in_RDI) {
      OutStream();
      Print::Print((Print *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [35])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38)
                       );
      Print::operator<<(in_stack_ffffffffffffef40,
                        (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [2])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38))
      ;
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [35])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38)
                       );
      Print::operator<<(in_stack_ffffffffffffef40,
                        (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [2])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38))
      ;
      Print::~Print(in_stack_ffffffffffffefb0);
    }
  }
  *(Real *)(in_RDI + 0x56) = local_d0;
  *(Real *)(in_RDI + 0x54) = local_d8;
  std::__cxx11::string::string(local_2c8);
  if ((in_RDI[0x10] != 0) || (local_d0 <= local_d8)) {
    std::__cxx11::string::operator=(local_2c8,"bnorm");
    local_2a8 = local_d8;
  }
  else {
    std::__cxx11::string::operator=(local_2c8,"resid0");
    local_2a8 = local_d0;
  }
  local_2e0 = 1e-16;
  pdVar7 = std::max<double>(local_48,&local_2e0);
  local_2d8 = *pdVar7 * local_2a8;
  pdVar7 = std::max<double>(&local_50,&local_2d8);
  local_2d0 = *pdVar7;
  if (((local_a9 & 1) != 0) || (local_2d0 < local_d0)) {
    local_470 = second();
    local_471 = 0;
    if (in_RDI[2] == 0) {
      local_eb4 = in_RDI[1];
    }
    else {
      local_eb4 = in_RDI[2];
    }
    local_478 = local_eb4;
    for (local_47c = 0; local_47c < local_478; local_47c = local_47c + 1) {
      oneIter(in_stack_fffffffffffff000,(int)((ulong)in_stack_ffffffffffffeff8 >> 0x20));
      local_471 = 0;
      computeResidual(in_stack_ffffffffffffef70,(int)((ulong)in_stack_ffffffffffffef68 >> 0x20));
      if ((local_a9 & 1) == 0) {
        local_488 = ResNormInf(in_stack_ffffffffffffef50,in_stack_ffffffffffffef4c,
                               SUB41((uint)in_stack_ffffffffffffef48 >> 0x18,0));
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffef50,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48));
        *local_c0 = local_488;
        if (1 < *in_RDI) {
          OutStream();
          Print::Print((Print *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
          Print::operator<<(in_stack_ffffffffffffef40,
                            (char (*) [17])
                            CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          local_614 = (int)std::setw(3);
          Print::operator<<((Print *)in_stack_ffffffffffffef50,
                            (_Setw *)CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48));
          local_618 = local_47c + 1;
          Print::operator<<(in_stack_ffffffffffffef40,
                            (int *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          Print::operator<<(in_stack_ffffffffffffef40,
                            (char (*) [13])
                            CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          Print::operator<<(in_stack_ffffffffffffef40,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          Print::operator<<(in_stack_ffffffffffffef40,
                            (char (*) [4])
                            CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          local_620 = local_488 / local_2a8;
          Print::operator<<(in_stack_ffffffffffffef40,
                            (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38))
          ;
          Print::operator<<(in_stack_ffffffffffffef40,
                            (char (*) [2])
                            CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
          Print::~Print(in_stack_ffffffffffffefb0);
        }
        local_621 = local_488 <= local_2d0;
        if ((in_RDI[0x14] == 1) && ((bool)local_621)) {
          local_471 = 1;
        }
        else if ((bool)local_621) {
          computeMLResidual(in_stack_ffffffffffffefc0,
                            (int)((ulong)in_stack_ffffffffffffefb8 >> 0x20));
          local_630 = MLResNormInf(in_stack_ffffffffffffef60,
                                   (int)((ulong)in_stack_ffffffffffffef58 >> 0x20),
                                   SUB81((ulong)in_stack_ffffffffffffef58 >> 0x18,0));
          if (1 < *in_RDI) {
            OutStream();
            Print::Print((Print *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [17])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            std::setw(3);
            Print::operator<<((Print *)in_stack_ffffffffffffef50,
                              (_Setw *)CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48)
                             );
            Print::operator<<(in_stack_ffffffffffffef40,
                              (int *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [13])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [4])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (double *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [2])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::~Print(in_stack_ffffffffffffefb0);
          }
          local_471 = local_630 <= local_2d0;
          pdVar7 = std::max<double>(&local_488,&local_630);
          *local_c0 = *pdVar7;
        }
        else {
          local_471 = 0;
        }
        if ((local_471 & 1) != 0) {
          if (0 < *in_RDI) {
            OutStream();
            Print::Print((Print *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [19])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (int *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [15])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [4])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (double *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [3])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (double *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [2])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::~Print(in_stack_ffffffffffffefb0);
          }
          break;
        }
        if (local_2a8 * 1e+20 < *local_c0) {
          if (0 < *in_RDI) {
            OutStream();
            Print::Print((Print *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [33])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            local_aec = local_47c + 1;
            Print::operator<<(in_stack_ffffffffffffef40,
                              (int *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [13])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [15])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [4])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (double *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [3])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            local_af8 = *local_c0 / local_2a8;
            Print::operator<<(in_stack_ffffffffffffef40,
                              (double *)
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::operator<<(in_stack_ffffffffffffef40,
                              (char (*) [2])
                              CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
            Print::~Print(in_stack_ffffffffffffefb0);
          }
          local_20 = "MLMG failing so lets stop here";
          Abort_host((char *)in_stack_ffffffffffffef50);
        }
      }
    }
    if (((local_471 & 1) == 0) && (in_RDI[2] == 0)) {
      if (0 < *in_RDI) {
        OutStream();
        Print::Print((Print *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
        Print::operator<<(in_stack_ffffffffffffef40,
                          (char (*) [32])
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (int *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (char (*) [13])
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (char (*) [15])
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (char (*) [4])
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (char (*) [3])
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        local_c88 = *local_c0 / local_2a8;
        Print::operator<<(in_stack_ffffffffffffef40,
                          (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::operator<<(in_stack_ffffffffffffef40,
                          (char (*) [2])
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
        Print::~Print(in_stack_ffffffffffffefb0);
      }
      local_28 = "MLMG failed";
      Abort_host((char *)in_stack_ffffffffffffef50);
    }
    dVar11 = second();
    dVar11 = dVar11 - local_470;
    pdVar7 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffef40,
                        CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    *pdVar7 = dVar11;
  }
  else {
    *local_c0 = local_d0;
    if (0 < *in_RDI) {
      OutStream();
      Print::Print((Print *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [28])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38)
                       );
      Print::~Print(in_stack_ffffffffffffefb0);
    }
  }
  if (in_RDI[0x11] == 0) {
    IntVect::IntVect(&local_c94,0);
  }
  else {
    IntVect::IntVect(&local_c94,1);
  }
  bVar3 = MLLinOp::hasHiddenDimension((MLLinOp *)0x1256607);
  if (bVar3) {
    iVar4 = MLLinOp::hiddenDirection(*(MLLinOp **)(in_RDI + 0x12));
    local_c94.vect[iVar4] = 0;
    local_c = iVar4;
    local_8 = &local_c94;
  }
  for (local_c98 = 0; local_c98 < in_RDI[0x14]; local_c98 = local_c98 + 1) {
    piVar8 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffef40,
                        CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
    if (*piVar8 == 0) {
      plVar1 = *(long **)(in_RDI + 0x12);
      pAVar9 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_ffffffffffffef40,
                          CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      pAVar10 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                          ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                           in_stack_ffffffffffffef40,
                           CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      (**(code **)(*plVar1 + 0x160))(plVar1,pAVar9,pAVar10,&local_c94);
    }
  }
  dVar11 = second();
  dVar11 = dVar11 - local_b8;
  pdVar7 = Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffef40,
                      CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
  *pdVar7 = dVar11;
  if (0 < *in_RDI) {
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x1256777);
    Vector<double,_std::allocator<double>_>::size
              ((Vector<double,_std::allocator<double>_> *)0x1256786);
    ParallelContext::CommunicatorSub();
    ParallelReduce::Max<double>
              ((double *)in_stack_ffffffffffffef40,in_stack_ffffffffffffef3c,
               in_stack_ffffffffffffef38,0);
    iVar4 = ParallelContext::MyProcSub();
    if (iVar4 == 0) {
      OutStream();
      AllPrint::AllPrint((AllPrint *)in_stack_ffffffffffffef40,
                         (ostream *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [23])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38)
                       );
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffef40,
                 CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [9])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38))
      ;
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffef40,
                 CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [11])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38)
                       );
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffef40,
                 CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (double *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
      Print::operator<<(in_stack_ffffffffffffef40,
                        (char (*) [2])CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38))
      ;
      AllPrint::~AllPrint((AllPrint *)0x12568c2);
    }
  }
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  dVar11 = *local_c0;
  std::__cxx11::string::~string(local_2c8);
  return dVar11;
}

Assistant:

Real
MLMG::solve (Vector<Any>& a_sol, const Vector<Any>& a_rhs,
             Real a_tol_rel, Real a_tol_abs, const char* checkpoint_file)
{
    BL_PROFILE("MLMG::solve()");

    if (checkpoint_file != nullptr) {
        if (a_sol[0].is<MultiFab>()) {
            Vector<MultiFab*> mf_sol(namrlevs);
            Vector<MultiFab const*> mf_rhs(namrlevs);
            for (int lev = 0; lev < namrlevs; ++lev) {
                mf_sol[lev] = &(a_sol[lev].get<MultiFab>());
                mf_rhs[lev] = &(a_rhs[lev].get<MultiFab>());
            }
            checkPoint(mf_sol, mf_rhs, a_tol_rel, a_tol_abs, checkpoint_file);
        } else {
            amrex::Abort("MLMG::solve: checkpoint not supported for non-MultiFab type");
        }
    }

    if (bottom_solver == BottomSolver::Default) {
        bottom_solver = linop.getDefaultBottomSolver();
    }

#if defined(AMREX_USE_HYPRE) || defined(AMREX_USE_PETSC)
    if (bottom_solver == BottomSolver::hypre || bottom_solver == BottomSolver::petsc) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(a_sol[0].is<MultiFab>(),
                                         "Non-MultiFab type not supported for hypre and petsc");
        int mo = linop.getMaxOrder();
        if (a_sol[0].get<MultiFab>().hasEBFabFactory()) {
            linop.setMaxOrder(2);
        } else {
            linop.setMaxOrder(std::min(3,mo));  // maxorder = 4 not supported
        }
    }
#endif

    bool is_nsolve = linop.m_parent;

    auto solve_start_time = amrex::second();

    Real& composite_norminf = m_final_resnorm0;

    m_niters_cg.clear();
    m_iter_fine_resnorm0.clear();

    prepareForSolve(a_sol, a_rhs);

    computeMLResidual(finest_amr_lev);

    bool local = true;
    Real resnorm0 = MLResNormInf(finest_amr_lev, local);
    Real rhsnorm0 = MLRhsNormInf(local);
    if (!is_nsolve) {
        ParallelAllReduce::Max<Real>({resnorm0, rhsnorm0}, ParallelContext::CommunicatorSub());

        if (verbose >= 1)
        {
            amrex::Print() << "MLMG: Initial rhs               = " << rhsnorm0 << "\n"
                           << "MLMG: Initial residual (resid0) = " << resnorm0 << "\n";
        }
    }

    m_init_resnorm0 = resnorm0;
    m_rhsnorm0 = rhsnorm0;

    Real max_norm;
    std::string norm_name;
    if (always_use_bnorm || rhsnorm0 >= resnorm0) {
        norm_name = "bnorm";
        max_norm = rhsnorm0;
    } else {
        norm_name = "resid0";
        max_norm = resnorm0;
    }
    const Real res_target = std::max(a_tol_abs, std::max(a_tol_rel,Real(1.e-16))*max_norm);

    if (!is_nsolve && resnorm0 <= res_target) {
        composite_norminf = resnorm0;
        if (verbose >= 1) {
            amrex::Print() << "MLMG: No iterations needed\n";
        }
    } else {
        auto iter_start_time = amrex::second();
        bool converged = false;

        const int niters = do_fixed_number_of_iters ? do_fixed_number_of_iters : max_iters;
        for (int iter = 0; iter < niters; ++iter)
        {
            oneIter(iter);

            converged = false;

            // Test convergence on the fine amr level
            computeResidual(finest_amr_lev);

            if (is_nsolve) continue;

            Real fine_norminf = ResNormInf(finest_amr_lev);
            m_iter_fine_resnorm0.push_back(fine_norminf);
            composite_norminf = fine_norminf;
            if (verbose >= 2) {
                amrex::Print() << "MLMG: Iteration " << std::setw(3) << iter+1 << " Fine resid/"
                               << norm_name << " = " << fine_norminf/max_norm << "\n";
            }
            bool fine_converged = (fine_norminf <= res_target);

            if (namrlevs == 1 && fine_converged) {
                converged = true;
            } else if (fine_converged) {
                // finest level is converged, but we still need to test the coarse levels
                computeMLResidual(finest_amr_lev-1);
                Real crse_norminf = MLResNormInf(finest_amr_lev-1);
                if (verbose >= 2) {
                    amrex::Print() << "MLMG: Iteration " << std::setw(3) << iter+1
                                   << " Crse resid/" << norm_name << " = "
                                   << crse_norminf/max_norm << "\n";
                }
                converged = (crse_norminf <= res_target);
                composite_norminf = std::max(fine_norminf, crse_norminf);
            } else {
                converged = false;
            }

            if (converged) {
                if (verbose >= 1) {
                    amrex::Print() << "MLMG: Final Iter. " << iter+1
                                   << " resid, resid/" << norm_name << " = "
                                   << composite_norminf << ", "
                                   << composite_norminf/max_norm << "\n";
                }
                break;
            } else {
              if (composite_norminf > Real(1.e20)*max_norm)
              {
                  if (verbose > 0) {
                      amrex::Print() << "MLMG: Failing to converge after " << iter+1 << " iterations."
                                     << " resid, resid/" << norm_name << " = "
                                     << composite_norminf << ", "
                                     << composite_norminf/max_norm << "\n";
                  }
                  amrex::Abort("MLMG failing so lets stop here");
              }
            }
        }

        if (!converged && do_fixed_number_of_iters == 0) {
            if (verbose > 0) {
                amrex::Print() << "MLMG: Failed to converge after " << max_iters << " iterations."
                               << " resid, resid/" << norm_name << " = "
                               << composite_norminf << ", "
                               << composite_norminf/max_norm << "\n";
            }
            amrex::Abort("MLMG failed");
        }
        timer[iter_time] = amrex::second() - iter_start_time;
    }

    IntVect ng_back = final_fill_bc ? IntVect(1) : IntVect(0);
    if (linop.hasHiddenDimension()) {
        ng_back[linop.hiddenDirection()] = 0;
    }
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (!sol_is_alias[alev]) {
            linop.AnyCopy(a_sol[alev], sol[alev], ng_back);
        }
    }

    timer[solve_time] = amrex::second() - solve_start_time;
    if (verbose >= 1) {
        ParallelReduce::Max<double>(timer.data(), timer.size(), 0,
                                    ParallelContext::CommunicatorSub());
        if (ParallelContext::MyProcSub() == 0)
        {
            amrex::AllPrint() << "MLMG: Timers: Solve = " << timer[solve_time]
                              << " Iter = " << timer[iter_time]
                              << " Bottom = " << timer[bottom_time] << "\n";
        }
    }

    ++solve_called;

    return composite_norminf;
}